

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O1

aiNode * __thiscall Assimp::BVHLoader::ReadEndSite(BVHLoader *this,string *pParentName)

{
  int iVar1;
  aiNode *this_00;
  string token;
  string openBrace;
  string local_208;
  string local_1e8;
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [11];
  
  GetNextToken_abi_cxx11_(&local_1e8,this);
  iVar1 = std::__cxx11::string::compare((char *)&local_1e8);
  if (iVar1 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Expected opening brace \"{\", but found \"",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\".",2);
    std::__cxx11::stringbuf::str();
    ThrowException(this,&local_208);
  }
  this_00 = (aiNode *)operator_new(0x478);
  std::operator+(local_1a8,"EndSite_",pParentName);
  aiNode::aiNode(this_00,local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  local_208.field_2._M_local_buf[0] = '\0';
  while( true ) {
    local_208._M_string_length = 0;
    *local_208._M_dataplus._M_p = '\0';
    GetNextToken_abi_cxx11_(local_1a8,this);
    std::__cxx11::string::operator=((string *)&local_208,(string *)local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    iVar1 = std::__cxx11::string::compare((char *)&local_208);
    if (iVar1 != 0) break;
    ReadNodeOffset(this,this_00);
  }
  iVar1 = std::__cxx11::string::compare((char *)&local_208);
  if (iVar1 == 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,
                      CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                               local_208.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    return this_00;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Unknown keyword \"",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\".",2);
  std::__cxx11::stringbuf::str();
  ThrowException(this,&local_1c8);
}

Assistant:

aiNode* BVHLoader::ReadEndSite( const std::string& pParentName)
{
    // check opening brace
    std::string openBrace = GetNextToken();
    if( openBrace != "{")
        ThrowException( format() << "Expected opening brace \"{\", but found \"" << openBrace << "\".");

    // Create a node
    aiNode* node = new aiNode( "EndSite_" + pParentName);

    // now read the node's contents. Only possible entry is "OFFSET"
    std::string token;
    while( 1) {
        token.clear();
        token = GetNextToken();

        // end node's offset
        if( token == "OFFSET") {
            ReadNodeOffset( node);
        } else if( token == "}") {
            // we're done with the end node
            break;
        } else {
            // everything else is a parse error
            ThrowException( format() << "Unknown keyword \"" << token << "\"." );
        }
    }

    // and return the sub-hierarchy we built here
    return node;
}